

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode trynextip(connectdata *conn,int sockindex,int tempindex)

{
  int sock;
  bool bVar1;
  int local_34;
  Curl_addrinfo *pCStack_30;
  int family;
  Curl_addrinfo *ai;
  CURLcode local_20;
  curl_socket_t fd_to_close;
  CURLcode result;
  int other;
  int tempindex_local;
  int sockindex_local;
  connectdata *conn_local;
  
  local_20 = CURLE_COULDNT_CONNECT;
  sock = conn->tempsock[tempindex];
  conn->tempsock[tempindex] = -1;
  if (sockindex == 0) {
    pCStack_30 = (Curl_addrinfo *)0x0;
    local_34 = 0;
    if (conn->tempaddr[tempindex] != (Curl_addrinfo *)0x0) {
      local_34 = conn->tempaddr[tempindex]->ai_family;
      pCStack_30 = conn->tempaddr[tempindex]->ai_next;
    }
    for (; pCStack_30 != (Curl_addrinfo *)0x0; pCStack_30 = pCStack_30->ai_next) {
      if (conn->tempaddr[(int)(tempindex ^ 1)] != (Curl_addrinfo *)0x0) {
        while( true ) {
          bVar1 = false;
          if (pCStack_30 != (Curl_addrinfo *)0x0) {
            bVar1 = pCStack_30->ai_family != local_34;
          }
          if (!bVar1) break;
          pCStack_30 = pCStack_30->ai_next;
        }
      }
      if (pCStack_30 == (Curl_addrinfo *)0x0) break;
      local_20 = singleipconnect(conn,pCStack_30,conn->tempsock + tempindex);
      if (local_20 != CURLE_COULDNT_CONNECT) {
        conn->tempaddr[tempindex] = pCStack_30;
        break;
      }
    }
  }
  if (sock != -1) {
    Curl_closesocket(conn,sock);
  }
  return local_20;
}

Assistant:

static CURLcode trynextip(struct connectdata *conn,
                          int sockindex,
                          int tempindex)
{
  const int other = tempindex ^ 1;
  CURLcode result = CURLE_COULDNT_CONNECT;

  /* First clean up after the failed socket.
     Don't close it yet to ensure that the next IP's socket gets a different
     file descriptor, which can prevent bugs when the curl_multi_socket_action
     interface is used with certain select() replacements such as kqueue. */
  curl_socket_t fd_to_close = conn->tempsock[tempindex];
  conn->tempsock[tempindex] = CURL_SOCKET_BAD;

  if(sockindex == FIRSTSOCKET) {
    Curl_addrinfo *ai = NULL;
    int family = AF_UNSPEC;

    if(conn->tempaddr[tempindex]) {
      /* find next address in the same protocol family */
      family = conn->tempaddr[tempindex]->ai_family;
      ai = conn->tempaddr[tempindex]->ai_next;
    }
#ifdef ENABLE_IPV6
    else if(conn->tempaddr[0]) {
      /* happy eyeballs - try the other protocol family */
      int firstfamily = conn->tempaddr[0]->ai_family;
      family = (firstfamily == AF_INET) ? AF_INET6 : AF_INET;
      ai = conn->tempaddr[0]->ai_next;
    }
#endif

    while(ai) {
      if(conn->tempaddr[other]) {
        /* we can safely skip addresses of the other protocol family */
        while(ai && ai->ai_family != family)
          ai = ai->ai_next;
      }

      if(ai) {
        result = singleipconnect(conn, ai, &conn->tempsock[tempindex]);
        if(result == CURLE_COULDNT_CONNECT) {
          ai = ai->ai_next;
          continue;
        }

        conn->tempaddr[tempindex] = ai;
      }
      break;
    }
  }

  if(fd_to_close != CURL_SOCKET_BAD)
    Curl_closesocket(conn, fd_to_close);

  return result;
}